

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::build_chain_for_empty(Internal *this)

{
  uint uVar1;
  Clause *pCVar2;
  iterator iVar3;
  uint uVar4;
  unsigned_long in_RAX;
  long lVar5;
  long lVar6;
  uint64_t id;
  unsigned_long local_38;
  
  if ((this->lrat == true) &&
     ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pCVar2 = this->conflict;
    lVar6 = (long)pCVar2->size;
    local_38 = in_RAX;
    if (lVar6 != 0) {
      lVar5 = 0;
      do {
        uVar1 = *(uint *)((long)&pCVar2[1].field_0 + lVar5);
        uVar4 = uVar1;
        if ((int)uVar1 < 1) {
          uVar4 = -uVar1;
        }
        local_38 = (this->unit_clauses_idx).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)(uVar4 << 1 | -uVar1 >> 0x1f)];
        iVar3._M_current =
             (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain,iVar3,
                     &local_38);
        }
        else {
          *iVar3._M_current = local_38;
          (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        lVar5 = lVar5 + 4;
      } while (lVar6 * 4 != lVar5);
    }
    iVar3._M_current =
         (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain,iVar3,
                 (unsigned_long *)this->conflict);
    }
    else {
      *iVar3._M_current = (unsigned_long)this->conflict->field_0;
      (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
  }
  return;
}

Assistant:

void Internal::build_chain_for_empty () {
  if (!lrat || !lrat_chain.empty ())
    return;
  assert (!level);
  assert (lrat_chain.empty ());
  assert (conflict);
  LOG (conflict, "lrat for global empty clause with conflict");
  for (auto &lit : *conflict) {
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (conflict->id);
}